

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 exprCommute(Parse *pParse,Expr *pExpr)

{
  Expr *pEVar1;
  CollSeq *pCVar2;
  CollSeq *pCVar3;
  Expr *t;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  if ((pExpr->pLeft->op != 0xb1) && (pExpr->pRight->op != 0xb1)) {
    pCVar2 = sqlite3BinaryCompareCollSeq(pParse,pExpr->pLeft,pExpr->pRight);
    pCVar3 = sqlite3BinaryCompareCollSeq(pParse,pExpr->pRight,pExpr->pLeft);
    if (pCVar2 == pCVar3) goto LAB_001bff96;
  }
  pExpr->flags = pExpr->flags ^ 0x400;
LAB_001bff96:
  pEVar1 = pExpr->pRight;
  pExpr->pRight = pExpr->pLeft;
  pExpr->pLeft = pEVar1;
  if (0x35 < pExpr->op) {
    pExpr->op = (pExpr->op - 0x36 ^ 2) + 0x36;
  }
  return 0;
}

Assistant:

static u16 exprCommute(Parse *pParse, Expr *pExpr){
  if( pExpr->pLeft->op==TK_VECTOR
   || pExpr->pRight->op==TK_VECTOR
   || sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft, pExpr->pRight) !=
      sqlite3BinaryCompareCollSeq(pParse, pExpr->pRight, pExpr->pLeft)
  ){
    pExpr->flags ^= EP_Commuted;
  }
  SWAP(Expr*,pExpr->pRight,pExpr->pLeft);
  if( pExpr->op>=TK_GT ){
    assert( TK_LT==TK_GT+2 );
    assert( TK_GE==TK_LE+2 );
    assert( TK_GT>TK_EQ );
    assert( TK_GT<TK_LE );
    assert( pExpr->op>=TK_GT && pExpr->op<=TK_GE );
    pExpr->op = ((pExpr->op-TK_GT)^2)+TK_GT;
  }
  return 0;
}